

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

void Gia_ManChoiceLevel_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Tim_Man_t *p_00;
  ulong uVar1;
  int iVar2;
  int iVar3;
  int v;
  int iVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  iVar2 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar2 != 0) {
    return;
  }
  Gia_ObjSetTravIdCurrent(p,pObj);
  uVar1 = *(ulong *)pObj;
  uVar7 = (uint)uVar1;
  if ((~uVar7 & 0x9fffffff) == 0) {
    iVar2 = 0;
    if ((p_00 != (Tim_Man_t *)0x0) &&
       (iVar3 = Tim_ManBoxForCi(p_00,(uint)(uVar1 >> 0x20) & 0x1fffffff), iVar2 = 0, -1 < iVar3)) {
      v = Tim_ManBoxInputFirst(p_00,iVar3);
      iVar3 = Tim_ManBoxInputNum(p_00,iVar3);
      iVar2 = 0;
      if (iVar3 < 1) {
        iVar3 = 0;
        iVar2 = 0;
      }
      while (bVar8 = iVar3 != 0, iVar3 = iVar3 + -1, bVar8) {
        pGVar5 = Gia_ManCo(p,v);
        Gia_ManChoiceLevel_rec(p,pGVar5);
        iVar4 = Gia_ObjLevel(p,pGVar5);
        if (iVar2 < iVar4) {
          iVar2 = Gia_ObjLevel(p,pGVar5);
        }
        v = v + 1;
      }
      iVar2 = iVar2 + 1;
    }
    goto LAB_0057d9ce;
  }
  uVar6 = uVar1 & 0x1fffffff;
  if (uVar6 == 0x1fffffff || -1 < (int)uVar7) {
    if ((int)uVar7 < 0 || (int)uVar6 == 0x1fffffff) {
      if ((~uVar1 & 0x1fffffff1fffffff) != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                      ,0x2c1,"void Gia_ManChoiceLevel_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      goto LAB_0057d9cc;
    }
    pGVar5 = pObj + -uVar6;
    Gia_ManChoiceLevel_rec(p,pGVar5);
    iVar2 = Gia_ObjLevel(p,pGVar5);
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    else {
      iVar2 = Gia_ObjLevel(p,pGVar5);
    }
    pGVar5 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
    Gia_ManChoiceLevel_rec(p,pGVar5);
    iVar3 = Gia_ObjLevel(p,pGVar5);
    if (iVar2 < iVar3) {
      iVar2 = Gia_ObjLevel(p,pGVar5);
    }
    iVar2 = iVar2 + 1;
    iVar3 = Gia_ObjId(p,pObj);
    pGVar5 = Gia_ObjSiblObj(p,iVar3);
    if (pGVar5 == (Gia_Obj_t *)0x0) goto LAB_0057d9ce;
    Gia_ManChoiceLevel_rec(p,pGVar5);
    iVar3 = Gia_ObjLevel(p,pGVar5);
    if (iVar3 <= iVar2) goto LAB_0057d9ce;
  }
  else {
    pGVar5 = pObj + -uVar6;
    Gia_ManChoiceLevel_rec(p,pGVar5);
    iVar2 = Gia_ObjLevel(p,pGVar5);
    if (iVar2 < 1) {
LAB_0057d9cc:
      iVar2 = 0;
      goto LAB_0057d9ce;
    }
  }
  iVar2 = Gia_ObjLevel(p,pGVar5);
LAB_0057d9ce:
  iVar3 = Gia_ObjId(p,pObj);
  Vec_IntSetEntry(p->vLevels,iVar3,iVar2);
  return;
}

Assistant:

void Gia_ManChoiceLevel_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Obj_t * pNext;
    int i, iBox, iTerm1, nTerms, LevelMax = 0;
    if ( Gia_ObjIsTravIdCurrent( p, pObj ) )
        return;
    Gia_ObjSetTravIdCurrent( p, pObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        if ( pManTime )
        {
            iBox = Tim_ManBoxForCi( pManTime, Gia_ObjCioId(pObj) );
            if ( iBox >= 0 ) // this is not a true PI
            {
                iTerm1 = Tim_ManBoxInputFirst( pManTime, iBox );
                nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pNext = Gia_ManCo( p, iTerm1 + i );
                    Gia_ManChoiceLevel_rec( p, pNext );
                    if ( LevelMax < Gia_ObjLevel(p, pNext) )
                        LevelMax = Gia_ObjLevel(p, pNext);
                }
                LevelMax++;
            }
        }
//        Abc_Print( 1, "%d ", pObj->Level );
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        pNext = Gia_ObjFanin0(pObj);
        Gia_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Gia_ObjLevel(p, pNext) )
            LevelMax = Gia_ObjLevel(p, pNext);
    }
    else if ( Gia_ObjIsAnd(pObj) )
    { 
        // get the maximum level of the two fanins
        pNext = Gia_ObjFanin0(pObj);
        Gia_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Gia_ObjLevel(p, pNext) )
            LevelMax = Gia_ObjLevel(p, pNext);
        pNext = Gia_ObjFanin1(pObj);
        Gia_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Gia_ObjLevel(p, pNext) )
            LevelMax = Gia_ObjLevel(p, pNext);
        LevelMax++;

        // get the level of the nodes in the choice node
        if ( (pNext = Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))) )
        {
            Gia_ManChoiceLevel_rec( p, pNext );
            if ( LevelMax < Gia_ObjLevel(p, pNext) )
                LevelMax = Gia_ObjLevel(p, pNext);
        }
    }
    else if ( !Gia_ObjIsConst0(pObj) )
        assert( 0 );
    Gia_ObjSetLevel( p, pObj, LevelMax );
}